

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

void __thiscall musicBlock::OPLplayNote(musicBlock *this,uint channel,uchar note,int volume)

{
  bool bVar1;
  uint uVar2;
  OP2instrEntry *instrument;
  OP2instrEntry *instr;
  int i;
  int volume_local;
  uchar note_local;
  uint channel_local;
  musicBlock *this_local;
  
  if (volume == 0) {
    OPLreleaseNote(this,channel,note);
  }
  else {
    instrument = getInstrument(this,channel,note);
    if (instrument != (OP2instrEntry *)0x0) {
      uVar2 = 0;
      if (channel == 0xf) {
        uVar2 = 2;
      }
      uVar2 = findFreeChannel(this,uVar2,channel,note);
      if (((uVar2 != 0xffffffff) &&
          (occupyChannel(this,uVar2,channel,(uint)note,volume,instrument,'\0'),
          (instrument->flags & 4) != 0)) &&
         (bVar1 = FBoolCVar::operator_cast_to_bool(&opl_singlevoice), !bVar1)) {
        uVar2 = 1;
        if (channel == 0xf) {
          uVar2 = 3;
        }
        uVar2 = findFreeChannel(this,uVar2,channel,note);
        if (uVar2 != 0xffffffff) {
          occupyChannel(this,uVar2,channel,(uint)note,volume,instrument,'\x01');
        }
      }
    }
  }
  return;
}

Assistant:

void musicBlock::OPLplayNote(uint channel, uchar note, int volume)
{
	int i;
	struct OP2instrEntry *instr;

	if (volume == 0)
	{
		OPLreleaseNote (channel, note);
		return;
	}

	if ( (instr = getInstrument(channel, note)) == NULL )
		return;

	if ( (i = findFreeChannel((channel == PERCUSSION) ? 2 : 0, channel, note)) != -1)
	{
		occupyChannel(i, channel, note, volume, instr, 0);
		if ((instr->flags & FL_DOUBLE_VOICE) && !opl_singlevoice)
		{
			if ( (i = findFreeChannel((channel == PERCUSSION) ? 3 : 1, channel, note)) != -1)
				occupyChannel(i, channel, note, volume, instr, 1);
		}
	}
}